

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O0

void R_RenderFakeWallRange(drawseg_t *ds,int x1,int x2)

{
  sector_t *psVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  FTextureID FVar7;
  int iVar8;
  F3DFloor **ppFVar9;
  lightlist_t *plVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  F3DFloor *local_120;
  F3DFloor *local_e0;
  lightlist_t *lit_3;
  lightlist_t *lit_2;
  lightlist_t *lit_1;
  lightlist_t *lit;
  sector_t *sec;
  double ceilingHeight;
  double floorHeight;
  int last;
  int passed;
  F3DFloor *fover;
  F3DFloor *rover;
  int j;
  int i;
  FTexture *DONT_DRAW;
  int x2_local;
  int x1_local;
  drawseg_t *ds_local;
  
  _last = (F3DFloor *)0x0;
  sprflipvert = false;
  curline = ds->curline;
  psVar1 = curline->frontsector;
  backsector = curline->backsector;
  if (backsector == (sector_t *)0x0) {
    frontsector = psVar1;
    sprflipvert = false;
    return;
  }
  frontsector = psVar1;
  if ((ds->bFakeBoundary & 3) == 2) {
    frontsector = backsector;
    backsector = psVar1;
  }
  dVar11 = sector_t::CenterFloor(backsector);
  dVar12 = sector_t::CenterCeiling(backsector);
  if ((fake3D & 1U) == 0) {
    sclipBottom = dVar11;
  }
  dVar14 = sclipBottom;
  if ((fake3D & 2U) == 0) {
    sclipTop = dVar12;
  }
  dVar13 = sector_t::CenterCeiling(frontsector);
  dVar2 = sclipTop;
  if (dVar13 <= dVar14) {
    return;
  }
  dVar14 = sector_t::CenterFloor(frontsector);
  if (dVar2 <= dVar14) {
    return;
  }
  if ((fake3D & 8U) != 0) {
    bVar4 = false;
    rover._4_4_ = TArray<F3DFloor_*,_F3DFloor_*>::Size
                            ((TArray<F3DFloor_*,_F3DFloor_*> *)&backsector->e->XFloor);
LAB_0039af88:
    do {
      rover._4_4_ = rover._4_4_ - 1;
      _last = (F3DFloor *)0x0;
      if ((int)rover._4_4_ < 0) {
        return;
      }
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&backsector->e->XFloor,
                           (long)(int)rover._4_4_);
      local_e0 = *ppFVar9;
    } while ((local_e0->flags & 1) == 0);
    bVar5 = false;
    if ((((((local_e0->flags & 4) == 0) ||
          (bVar3 = secplane_t::isSlope((local_e0->top).plane), bVar3)) ||
         (bVar3 = secplane_t::isSlope((local_e0->bottom).plane), bVar3)) ||
        ((dVar14 = secplane_t::Zat0((local_e0->top).plane), dVar14 <= sclipBottom ||
         (dVar14 = secplane_t::Zat0((local_e0->bottom).plane), dVar12 <= dVar14)))) ||
       (dVar14 = secplane_t::Zat0((local_e0->top).plane), dVar14 <= dVar11)) goto LAB_0039b051;
    goto LAB_0039b067;
  }
  rover._4_4_ = 0;
  while( true ) {
    uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                      ((TArray<F3DFloor_*,_F3DFloor_*> *)&backsector->e->XFloor);
    if ((int)uVar6 <= (int)rover._4_4_) {
      return;
    }
    ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                        ((TArray<F3DFloor_*,_F3DFloor_*> *)&backsector->e->XFloor,
                         (long)(int)rover._4_4_);
    local_120 = *ppFVar9;
    if ((local_120->flags & 1) != 0) break;
LAB_0039c2bf:
    rover._4_4_ = rover._4_4_ + 1;
  }
  bVar4 = false;
  if (((((local_120->flags & 4) == 0) ||
       (bVar5 = secplane_t::isSlope((local_120->top).plane), bVar5)) ||
      (bVar5 = secplane_t::isSlope((local_120->bottom).plane), bVar5)) ||
     (((dVar14 = secplane_t::Zat0((local_120->bottom).plane), sclipTop <= dVar14 ||
       (dVar14 = secplane_t::Zat0((local_120->top).plane), dVar14 <= dVar11)) ||
      (dVar14 = secplane_t::Zat0((local_120->bottom).plane), dVar12 <= dVar14)))) {
    uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                      ((TArray<F3DFloor_*,_F3DFloor_*> *)&backsector->e->XFloor);
    if (rover._4_4_ != uVar6 - 1) goto LAB_0039c2bf;
    bVar4 = true;
  }
  rw_pic = (FTexture *)0x0;
  dVar11 = secplane_t::Zat0((local_120->top).plane);
  if ((dVar11 <= sclipBottom) || (bVar4)) {
    _last = (F3DFloor *)0x0;
    for (rover._0_4_ = 0;
        uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor),
        (int)(uint)rover < (int)uVar6; rover._0_4_ = (uint)rover + 1) {
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor,
                           (long)(int)(uint)rover);
      _last = *ppFVar9;
      if (_last->model == local_120->model) {
        _last = (F3DFloor *)0x0;
        break;
      }
      if (((((_last->flags & 1) != 0) && ((_last->flags & 4) != 0)) &&
          (bVar4 = secplane_t::isSlope((_last->top).plane), !bVar4)) &&
         ((bVar4 = secplane_t::isSlope((_last->bottom).plane), !bVar4 &&
          (dVar11 = secplane_t::Zat0((_last->bottom).plane), dVar11 < sclipTop)))) {
        dVar11 = secplane_t::Zat0((_last->top).plane);
        if (sclipBottom < dVar11) {
          if ((_last->flags & 0x2200) == 0) {
            _last = (F3DFloor *)0x0;
          }
        }
        else {
          _last = (F3DFloor *)0x0;
        }
        break;
      }
    }
    if (_last == (F3DFloor *)0x0) {
      return;
    }
    uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                      ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor);
    if ((uint)rover == uVar6) {
      return;
    }
    if ((_last->flags & local_120->flags & 0x10) == 0) {
      if ((_last->flags & 0x20000) == 0) {
        if ((_last->flags & 0x40000) == 0) {
          FVar7 = side_t::GetTexture(_last->master->sidedef[0],1);
          rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
        }
        else {
          FVar7 = side_t::GetTexture(curline->sidedef,2);
          rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
        }
      }
      else {
        FVar7 = side_t::GetTexture(curline->sidedef,0);
        rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
      }
    }
    else {
      rw_pic = (FTexture *)0xffffffffffffffff;
    }
  }
  else {
    uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                      ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor);
    if (uVar6 != 0) {
      _last = (F3DFloor *)0x0;
      for (rover._0_4_ = 0;
          uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                            ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor),
          (int)(uint)rover < (int)uVar6; rover._0_4_ = (uint)rover + 1) {
        ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                            ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor,
                             (long)(int)(uint)rover);
        _last = *ppFVar9;
        if (_last->model == local_120->model) break;
        if ((((_last->flags & 1) != 0) && ((_last->flags & 4) != 0)) &&
           ((bVar4 = secplane_t::isSlope((_last->top).plane), !bVar4 &&
            ((bVar4 = secplane_t::isSlope((_last->bottom).plane), !bVar4 &&
             (dVar11 = secplane_t::Zat0((_last->bottom).plane), dVar11 < sclipTop)))))) {
          dVar11 = secplane_t::Zat0((_last->top).plane);
          if (sclipBottom < dVar11) {
            if (((_last->flags & 2) != (local_120->flags & 2)) ||
               (((local_120->flags & 2) == 0 &&
                ((_last->alpha == 0xff || (local_120->alpha == 0xff)))))) {
              if ((_last->flags & local_120->flags & 0x10) != 0) {
                rw_pic = (FTexture *)0xffffffffffffffff;
              }
              _last = (F3DFloor *)0x0;
            }
          }
          else {
            _last = (F3DFloor *)0x0;
          }
          break;
        }
      }
      if ((_last != (F3DFloor *)0x0) &&
         (uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                            ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor),
         (uint)rover != uVar6)) {
        return;
      }
    }
  }
  if (rw_pic == (FTexture *)0x0) {
    _last = (F3DFloor *)0x0;
    if ((local_120->flags & 0x20000) == 0) {
      if ((local_120->flags & 0x40000) == 0) {
        FVar7 = side_t::GetTexture(local_120->master->sidedef[0],1);
        rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
      }
      else {
        FVar7 = side_t::GetTexture(curline->sidedef,2);
        rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
      }
    }
    else {
      FVar7 = side_t::GetTexture(curline->sidedef,0);
      rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
    }
  }
  basecolormap = frontsector->ColorMap;
  wallshade = ds->shade;
  if (fixedlightlev < 0) {
    if ((ds->bFakeBoundary & 3) == 2) {
      rover._0_4_ = TArray<lightlist_t,_lightlist_t>::Size(&(backsector->e->XFloor).lightlist);
      do {
        dVar11 = sclipTop;
        rover._0_4_ = (uint)rover - 1;
        if ((int)(uint)rover < 0) goto LAB_0039c245;
        plVar10 = TArray<lightlist_t,_lightlist_t>::operator[]
                            (&(backsector->e->XFloor).lightlist,(long)(int)(uint)rover);
        dVar12 = secplane_t::Zat0(&plVar10->plane);
      } while (dVar12 < dVar11);
      plVar10 = TArray<lightlist_t,_lightlist_t>::operator[]
                          (&(backsector->e->XFloor).lightlist,(long)(int)(uint)rover);
      basecolormap = plVar10->extra_colormap;
      iVar8 = side_t::GetLightLevel
                        (curline->sidedef,(bool)(foggy & 1),(int)*plVar10->p_lightlevel,
                         plVar10->lightsource != (F3DFloor *)0x0,(int *)0x0);
      wallshade = (iVar8 + r_actualextralight + 0xc) * -0x4000 + 0x400000;
    }
    else {
      rover._0_4_ = TArray<lightlist_t,_lightlist_t>::Size(&(frontsector->e->XFloor).lightlist);
      do {
        dVar11 = sclipTop;
        rover._0_4_ = (uint)rover - 1;
        if ((int)(uint)rover < 0) goto LAB_0039c245;
        plVar10 = TArray<lightlist_t,_lightlist_t>::operator[]
                            (&(frontsector->e->XFloor).lightlist,(long)(int)(uint)rover);
        dVar12 = secplane_t::Zat0(&plVar10->plane);
      } while (dVar12 < dVar11);
      plVar10 = TArray<lightlist_t,_lightlist_t>::operator[]
                          (&(frontsector->e->XFloor).lightlist,(long)(int)(uint)rover);
      basecolormap = plVar10->extra_colormap;
      iVar8 = side_t::GetLightLevel
                        (curline->sidedef,(bool)(foggy & 1),(int)*plVar10->p_lightlevel,
                         plVar10->lightsource != (F3DFloor *)0x0,(int *)0x0);
      wallshade = (iVar8 + r_actualextralight + 0xc) * -0x4000 + 0x400000;
    }
  }
LAB_0039c245:
  if (rw_pic == (FTexture *)0xffffffffffffffff) {
    rw_pic = (FTexture *)0x0;
  }
  else {
    if (_last != (F3DFloor *)0x0) {
      local_120 = _last;
    }
    R_RenderFakeWall(ds,x1,x2,local_120);
  }
  return;
LAB_0039b051:
  if (rover._4_4_ == 0) {
    bVar5 = true;
LAB_0039b067:
    rw_pic = (FTexture *)0x0;
    dVar14 = secplane_t::Zat0((local_e0->bottom).plane);
    if ((sclipTop <= dVar14) || (bVar5)) {
      if (bVar4) {
        return;
      }
      _last = (F3DFloor *)0x0;
      rover._0_4_ = TArray<F3DFloor_*,_F3DFloor_*>::Size
                              ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor);
      goto LAB_0039b0c8;
    }
    uVar6 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                      ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor);
    if (uVar6 == 0) goto LAB_0039b4a7;
    _last = (F3DFloor *)0x0;
    rover._0_4_ = TArray<F3DFloor_*,_F3DFloor_*>::Size
                            ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor);
    do {
      rover._0_4_ = (uint)rover - 1;
      if ((int)(uint)rover < 0) goto LAB_0039b482;
      ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                          ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor,
                           (long)(int)(uint)rover);
      _last = *ppFVar9;
      if (_last->model == local_e0->model) goto LAB_0039b482;
    } while ((((_last->flags & 1) == 0) || ((_last->flags & 4) == 0)) ||
            ((bVar4 = secplane_t::isSlope((_last->top).plane), bVar4 ||
             ((bVar4 = secplane_t::isSlope((_last->bottom).plane), bVar4 ||
              (dVar14 = secplane_t::Zat0((_last->top).plane), dVar14 <= sclipBottom))))));
    dVar14 = secplane_t::Zat0((_last->bottom).plane);
    if (dVar14 < sclipTop) {
      if (((_last->flags & 2) != (local_e0->flags & 2)) ||
         (((_last->flags & 2) == 0 && ((_last->alpha == 0xff || (local_e0->alpha == 0xff)))))) {
        if ((_last->flags & local_e0->flags & 0x10) != 0) {
          rw_pic = (FTexture *)0xffffffffffffffff;
        }
        _last = (F3DFloor *)0x0;
      }
    }
    else {
      _last = (F3DFloor *)0x0;
    }
LAB_0039b482:
    if ((_last == (F3DFloor *)0x0) || ((uint)rover == 0xffffffff)) goto LAB_0039b4a7;
    bVar4 = true;
  }
  goto LAB_0039af88;
  while( true ) {
    ppFVar9 = TArray<F3DFloor_*,_F3DFloor_*>::operator[]
                        ((TArray<F3DFloor_*,_F3DFloor_*> *)&frontsector->e->XFloor,
                         (long)(int)(uint)rover);
    _last = *ppFVar9;
    if (_last->model == local_e0->model) {
      _last = (F3DFloor *)0x0;
      goto LAB_0039b1d2;
    }
    if (((((_last->flags & 1) != 0) && ((_last->flags & 4) != 0)) &&
        (bVar4 = secplane_t::isSlope((_last->top).plane), !bVar4)) &&
       ((bVar4 = secplane_t::isSlope((_last->bottom).plane), !bVar4 &&
        (dVar11 = secplane_t::Zat0((_last->top).plane), sclipBottom < dVar11)))) break;
LAB_0039b0c8:
    rover._0_4_ = (uint)rover - 1;
    if ((int)(uint)rover < 0) goto LAB_0039b1d2;
  }
  dVar11 = secplane_t::Zat0((_last->bottom).plane);
  if (dVar11 < sclipTop) {
    if ((_last->flags & 0x2200) == 0) {
      _last = (F3DFloor *)0x0;
    }
  }
  else {
    _last = (F3DFloor *)0x0;
  }
LAB_0039b1d2:
  if (_last == (F3DFloor *)0x0) {
    return;
  }
  if ((uint)rover == 0xffffffff) {
    return;
  }
  if ((_last->flags & local_e0->flags & 0x10) == 0) {
    if ((_last->flags & 0x20000) == 0) {
      if ((_last->flags & 0x40000) == 0) {
        FVar7 = side_t::GetTexture(_last->master->sidedef[0],1);
        rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
      }
      else {
        FVar7 = side_t::GetTexture(curline->sidedef,2);
        rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
      }
    }
    else {
      FVar7 = side_t::GetTexture(curline->sidedef,0);
      rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
    }
  }
  else {
    rw_pic = (FTexture *)0xffffffffffffffff;
  }
LAB_0039b4a7:
  if (rw_pic == (FTexture *)0x0) {
    _last = (F3DFloor *)0x0;
    if ((local_e0->flags & 0x20000) == 0) {
      if ((local_e0->flags & 0x40000) == 0) {
        FVar7 = side_t::GetTexture(local_e0->master->sidedef[0],1);
        rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
      }
      else {
        FVar7 = side_t::GetTexture(curline->sidedef,2);
        rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
      }
    }
    else {
      FVar7 = side_t::GetTexture(curline->sidedef,0);
      rw_pic = FTextureManager::operator()(&TexMan,FVar7,true);
    }
  }
  basecolormap = frontsector->ColorMap;
  wallshade = ds->shade;
  if (fixedlightlev < 0) {
    if ((ds->bFakeBoundary & 3) == 2) {
      rover._0_4_ = TArray<lightlist_t,_lightlist_t>::Size(&(backsector->e->XFloor).lightlist);
      do {
        dVar11 = sclipTop;
        rover._0_4_ = (uint)rover - 1;
        if ((int)(uint)rover < 0) goto LAB_0039b82b;
        plVar10 = TArray<lightlist_t,_lightlist_t>::operator[]
                            (&(backsector->e->XFloor).lightlist,(long)(int)(uint)rover);
        dVar12 = secplane_t::Zat0(&plVar10->plane);
      } while (dVar12 < dVar11);
      plVar10 = TArray<lightlist_t,_lightlist_t>::operator[]
                          (&(backsector->e->XFloor).lightlist,(long)(int)(uint)rover);
      basecolormap = plVar10->extra_colormap;
      iVar8 = side_t::GetLightLevel
                        (curline->sidedef,(bool)(foggy & 1),(int)*plVar10->p_lightlevel,
                         plVar10->lightsource != (F3DFloor *)0x0,(int *)0x0);
      wallshade = (iVar8 + r_actualextralight + 0xc) * -0x4000 + 0x400000;
    }
    else {
      rover._0_4_ = TArray<lightlist_t,_lightlist_t>::Size(&(frontsector->e->XFloor).lightlist);
      do {
        dVar11 = sclipTop;
        rover._0_4_ = (uint)rover - 1;
        if ((int)(uint)rover < 0) goto LAB_0039b82b;
        plVar10 = TArray<lightlist_t,_lightlist_t>::operator[]
                            (&(frontsector->e->XFloor).lightlist,(long)(int)(uint)rover);
        dVar12 = secplane_t::Zat0(&plVar10->plane);
      } while (dVar12 < dVar11);
      plVar10 = TArray<lightlist_t,_lightlist_t>::operator[]
                          (&(frontsector->e->XFloor).lightlist,(long)(int)(uint)rover);
      basecolormap = plVar10->extra_colormap;
      iVar8 = side_t::GetLightLevel
                        (curline->sidedef,(bool)(foggy & 1),(int)*plVar10->p_lightlevel,
                         plVar10->lightsource != (F3DFloor *)0x0,(int *)0x0);
      wallshade = (iVar8 + r_actualextralight + 0xc) * -0x4000 + 0x400000;
    }
  }
LAB_0039b82b:
  if (rw_pic != (FTexture *)0xffffffffffffffff) {
    if (_last != (F3DFloor *)0x0) {
      local_e0 = _last;
    }
    R_RenderFakeWall(ds,x1,x2,local_e0);
    return;
  }
  rw_pic = (FTexture *)0x0;
  return;
}

Assistant:

void R_RenderFakeWallRange (drawseg_t *ds, int x1, int x2)
{
	FTexture *const DONT_DRAW = ((FTexture*)(intptr_t)-1);
	int i,j;
	F3DFloor *rover, *fover = NULL;
	int passed, last;
	double floorHeight;
	double ceilingHeight;

	sprflipvert = false;
	curline = ds->curline;

	frontsector = curline->frontsector;
	backsector = curline->backsector;

	if (backsector == NULL)
	{
		return;
	}
	if ((ds->bFakeBoundary & 3) == 2)
	{
		sector_t *sec = backsector;
		backsector = frontsector;
		frontsector = sec;
	}

	floorHeight = backsector->CenterFloor();
	ceilingHeight = backsector->CenterCeiling();

	// maybe fix clipheights
	if (!(fake3D & FAKE3D_CLIPBOTTOM)) sclipBottom = floorHeight;
	if (!(fake3D & FAKE3D_CLIPTOP))    sclipTop = ceilingHeight;

	// maybe not visible
	if (sclipBottom >= frontsector->CenterCeiling()) return;
	if (sclipTop <= frontsector->CenterFloor()) return;

	if (fake3D & FAKE3D_DOWN2UP)
	{ // bottom to viewz
		last = 0;
		for (i = backsector->e->XFloor.ffloors.Size() - 1; i >= 0; i--) 
		{
			rover = backsector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;

			// visible?
			passed = 0;
			if (!(rover->flags & FF_RENDERSIDES) || rover->top.plane->isSlope() || rover->bottom.plane->isSlope() ||
				rover->top.plane->Zat0() <= sclipBottom ||
				rover->bottom.plane->Zat0() >= ceilingHeight ||
				rover->top.plane->Zat0() <= floorHeight)
			{
				if (!i)
				{
					passed = 1;
				}
				else
				{
					continue;
				}
			}

			rw_pic = NULL;
			if (rover->bottom.plane->Zat0() >= sclipTop || passed) 
			{
				if (last)
				{
					break;
				}
				// maybe wall from inside rendering?
				fover = NULL;
				for (j = frontsector->e->XFloor.ffloors.Size() - 1; j >= 0; j--)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						fover = NULL;
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->top.plane->Zat0() <= sclipBottom) continue; // no
					if (fover->bottom.plane->Zat0() >= sclipTop)
					{ // no, last possible
 						fover = NULL;
						break;
					}
					// it is, render inside?
					if (!(fover->flags & (FF_BOTHPLANES|FF_INVERTPLANES)))
					{ // no
						fover = NULL;
					}
					break;
				}
				// nothing
				if (!fover || j == -1)
				{
					break;
				}
				// correct texture
				if (fover->flags & rover->flags & FF_SWIMMABLE)
				{	// don't ever draw (but treat as something has been found)
					rw_pic = DONT_DRAW;
				}
				else if(fover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if(fover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(fover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			} 
			else if (frontsector->e->XFloor.ffloors.Size()) 
			{
				// maybe not visible?
				fover = NULL;
				for (j = frontsector->e->XFloor.ffloors.Size() - 1; j >= 0; j--)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model) // never
					{
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->top.plane->Zat0() <= sclipBottom) continue; // no
					if (fover->bottom.plane->Zat0() >= sclipTop)
					{ // visible, last possible
 						fover = NULL;
						break;
					}
					if ((fover->flags & FF_SOLID) == (rover->flags & FF_SOLID) &&
						!(!(fover->flags & FF_SOLID) && (fover->alpha == 255 || rover->alpha == 255))
					)
					{
						break;
					}
					if (fover->flags & rover->flags & FF_SWIMMABLE)
					{ // don't ever draw (but treat as something has been found)
						rw_pic = DONT_DRAW;
					}
					fover = NULL; // visible
					break;
				}
				if (fover && j != -1)
				{
					fover = NULL;
					last = 1;
					continue; // not visible
				}
			}
			if (!rw_pic) 
			{
				fover = NULL;
				if (rover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if(rover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(rover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			// correct colors now
			basecolormap = frontsector->ColorMap;
			wallshade = ds->shade;
			if (fixedlightlev < 0)
			{
				if ((ds->bFakeBoundary & 3) == 2)
				{
					for (j = backsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= backsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &backsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
				else
				{
					for (j = frontsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= frontsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &frontsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
			}
			if (rw_pic != DONT_DRAW)
			{
				R_RenderFakeWall(ds, x1, x2, fover ? fover : rover);
			}
			else rw_pic = NULL;
			break;
		}
	}
	else
	{ // top to viewz
		for (i = 0; i < (int)backsector->e->XFloor.ffloors.Size(); i++)
		{
			rover = backsector->e->XFloor.ffloors[i];
			if (!(rover->flags & FF_EXISTS)) continue;

			// visible?
			passed = 0;
			if (!(rover->flags & FF_RENDERSIDES) ||
				rover->top.plane->isSlope() || rover->bottom.plane->isSlope() ||
				rover->bottom.plane->Zat0() >= sclipTop ||
				rover->top.plane->Zat0() <= floorHeight ||
				rover->bottom.plane->Zat0() >= ceilingHeight)
			{
				if ((unsigned)i == backsector->e->XFloor.ffloors.Size() - 1)
				{
					passed = 1;
				}
				else
				{
					continue;
				}
			}
			rw_pic = NULL;
			if (rover->top.plane->Zat0() <= sclipBottom || passed)
			{ // maybe wall from inside rendering?
				fover = NULL;
				for (j = 0; j < (int)frontsector->e->XFloor.ffloors.Size(); j++)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						fover = NULL;
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, it's bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->bottom.plane->Zat0() >= sclipTop) continue; // no
					if (fover->top.plane->Zat0() <= sclipBottom)
					{ // no, last possible
 						fover = NULL;
						break;
					}
					// it is, render inside?
					if (!(fover->flags & (FF_BOTHPLANES|FF_INVERTPLANES)))
					{ // no
						fover = NULL;
					}
					break;
				}
				// nothing
				if (!fover || (unsigned)j == frontsector->e->XFloor.ffloors.Size())
				{
					break;
				}
				// correct texture
				if (fover->flags & rover->flags & FF_SWIMMABLE)
				{
					rw_pic = DONT_DRAW;	// don't ever draw (but treat as something has been found)
				}
				else if (fover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if (fover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(fover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			else if (frontsector->e->XFloor.ffloors.Size())
			{ // maybe not visible?
				fover = NULL;
				for (j = 0; j < (int)frontsector->e->XFloor.ffloors.Size(); j++)
				{
					fover = frontsector->e->XFloor.ffloors[j];
					if (fover->model == rover->model)
					{ // never
						break;
					}
					if (!(fover->flags & FF_EXISTS)) continue;
					if (!(fover->flags & FF_RENDERSIDES)) continue;
					// no sloped walls, its bugged
					if (fover->top.plane->isSlope() || fover->bottom.plane->isSlope()) continue;

					// visible?
					if (fover->bottom.plane->Zat0() >= sclipTop) continue; // no
					if (fover->top.plane->Zat0() <= sclipBottom)
					{ // visible, last possible
 						fover = NULL;
						break;
					}
					if ((fover->flags & FF_SOLID) == (rover->flags & FF_SOLID) &&
						!(!(rover->flags & FF_SOLID) && (fover->alpha == 255 || rover->alpha == 255))
					)
					{
						break;
					}
					if (fover->flags & rover->flags & FF_SWIMMABLE)
					{ // don't ever draw (but treat as something has been found)
						rw_pic = DONT_DRAW;
					}
					fover = NULL; // visible
					break;
				}
				if (fover && (unsigned)j != frontsector->e->XFloor.ffloors.Size())
				{ // not visible
					break;
				}
			}
			if (rw_pic == NULL)
			{
				fover = NULL;
				if (rover->flags & FF_UPPERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::top), true);
				}
				else if (rover->flags & FF_LOWERTEXTURE)
				{
					rw_pic = TexMan(curline->sidedef->GetTexture(side_t::bottom), true);
				}
				else
				{
					rw_pic = TexMan(rover->master->sidedef[0]->GetTexture(side_t::mid), true);
				}
			}
			// correct colors now
			basecolormap = frontsector->ColorMap;
			wallshade = ds->shade;
			if (fixedlightlev < 0)
			{
				if ((ds->bFakeBoundary & 3) == 2)
				{
					for (j = backsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if (sclipTop <= backsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &backsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
				else
				{
					for (j = frontsector->e->XFloor.lightlist.Size() - 1; j >= 0; j--)
					{
						if(sclipTop <= frontsector->e->XFloor.lightlist[j].plane.Zat0())
						{
							lightlist_t *lit = &frontsector->e->XFloor.lightlist[j];
							basecolormap = lit->extra_colormap;
							wallshade = LIGHT2SHADE(curline->sidedef->GetLightLevel(foggy, *lit->p_lightlevel, lit->lightsource != NULL) + r_actualextralight);
							break;
						}
					}
				}
			}

			if (rw_pic != DONT_DRAW)
			{
				R_RenderFakeWall(ds, x1, x2, fover ? fover : rover);
			}
			else
			{
				rw_pic = NULL;
			}
			break;
		}
	}
	return;
}